

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::PHA_IP(CPU *this)

{
  this->cycles = 3;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)(this->sp | 0x100),(ulong)this->A);
  this->sp = this->sp + 0xff;
  this->cycles = this->cycles - 2;
  return;
}

Assistant:

void CPU::PHA_IP()
{
    cycles = 3;
    WriteByteToStack(A);
}